

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

int __thiscall ghc::filesystem::path::compare(path *this,path *p)

{
  long lVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  string *psVar5;
  size_type sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  
  if (((((this->_path)._M_string_length < 3) ||
       (pcVar11 = (this->_path)._M_dataplus._M_p, *pcVar11 != '/')) || (pcVar11[1] != '/')) ||
     ((pcVar11[2] == 0x2f || (iVar3 = isprint((int)pcVar11[2]), iVar3 == 0)))) {
    psVar5 = (string *)0x0;
  }
  else {
    psVar5 = (string *)std::__cxx11::string::find((char)this,0x2f);
    if (psVar5 == (string *)0xffffffffffffffff) {
      psVar5 = (string *)(this->_path)._M_string_length;
    }
  }
  if ((((p->_path)._M_string_length < 3) || (pcVar11 = (p->_path)._M_dataplus._M_p, *pcVar11 != '/')
      ) || ((pcVar11[1] != '/' ||
            ((pcVar11[2] == 0x2f || (iVar3 = isprint((int)pcVar11[2]), iVar3 == 0)))))) {
    sVar6 = 0;
  }
  else {
    sVar6 = std::__cxx11::string::find((char)p,0x2f);
    if (sVar6 == 0xffffffffffffffff) {
      sVar6 = (p->_path)._M_string_length;
    }
  }
  iVar15 = (int)sVar6;
  iVar3 = std::__cxx11::string::compare((ulong)this,0,psVar5,(ulong)p,0);
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar8 = (this->_path)._M_string_length;
  if (uVar8 < 3) {
    uVar7 = 0;
LAB_0011f935:
    if (uVar7 < uVar8) {
      bVar16 = (this->_path)._M_dataplus._M_p[uVar7] == '/';
    }
    else {
LAB_0011f947:
      bVar16 = false;
    }
  }
  else {
    pcVar11 = (this->_path)._M_dataplus._M_p;
    if (*pcVar11 != '/') goto LAB_0011f947;
    bVar16 = true;
    if (((pcVar11[1] == '/') && (pcVar11[2] != 0x2f)) &&
       (iVar3 = isprint((int)pcVar11[2]), iVar3 != 0)) {
      uVar7 = std::__cxx11::string::find((char)this,0x2f);
      uVar8 = (this->_path)._M_string_length;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar8;
      }
      goto LAB_0011f935;
    }
  }
  uVar8 = (p->_path)._M_string_length;
  if (uVar8 < 3) {
    uVar7 = 0;
LAB_0011f99f:
    if (uVar7 < uVar8) {
      pcVar11 = (p->_path)._M_dataplus._M_p;
      if (bVar16 == (pcVar11[uVar7] == '/')) goto LAB_0011f9cc;
    }
    else if (bVar16 == false) {
      pcVar11 = (p->_path)._M_dataplus._M_p;
      goto LAB_0011f9d7;
    }
LAB_0011fa2b:
    uVar4 = bVar16 - 1 | 1;
  }
  else {
    pcVar11 = (p->_path)._M_dataplus._M_p;
    if (*pcVar11 == '/') {
      if (((pcVar11[1] == '/') && (pcVar11[2] != 0x2f)) &&
         (iVar3 = isprint((int)pcVar11[2]), iVar3 != 0)) {
        uVar7 = std::__cxx11::string::find((char)p,0x2f);
        uVar8 = (p->_path)._M_string_length;
        if (uVar7 == 0xffffffffffffffff) {
          uVar7 = uVar8;
        }
        goto LAB_0011f99f;
      }
      if (bVar16 == false) goto LAB_0011fa2b;
LAB_0011f9cc:
      if (bVar16 != false) {
        psVar5 = psVar5 + 1;
        iVar15 = iVar15 + 1;
      }
    }
    else if (bVar16 != false) goto LAB_0011fa2b;
LAB_0011f9d7:
    uVar12 = (ulong)(int)psVar5;
    pcVar2 = (this->_path)._M_dataplus._M_p;
    uVar7 = (this->_path)._M_string_length;
    pcVar10 = pcVar2 + uVar12;
    uVar13 = (ulong)iVar15;
    pcVar9 = pcVar11 + uVar13;
    if ((uVar12 != uVar7) && (uVar13 != uVar8)) {
      lVar14 = 0;
      do {
        if (pcVar10[lVar14] != pcVar9[lVar14]) {
          pcVar10 = pcVar10 + lVar14;
          pcVar9 = pcVar9 + lVar14;
          goto LAB_0011fa3c;
        }
        lVar1 = lVar14 + 1;
      } while ((~uVar12 + uVar7 != lVar14) &&
              (bVar16 = ~uVar13 + uVar8 != lVar14, lVar14 = lVar1, bVar16));
      pcVar10 = pcVar10 + lVar1;
      pcVar9 = pcVar9 + lVar1;
    }
LAB_0011fa3c:
    if (pcVar10 == pcVar2 + uVar7) {
      uVar4 = -(uint)(pcVar9 != pcVar11 + uVar8);
    }
    else {
      uVar4 = 1;
      if (pcVar9 != pcVar11 + uVar8) {
        uVar4 = 0xffffffff;
        if (*pcVar10 != '/') {
          uVar4 = 1;
          if (*pcVar9 != '/') {
            uVar4 = (uint)(*pcVar9 <= *pcVar10) * 2 - 1;
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

GHC_INLINE int path::compare(const path& p) const noexcept
{
#ifdef LWG_2936_BEHAVIOUR
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
#ifdef GHC_OS_WINDOWS
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
#else
    auto rnc = _path.compare(0, rnl1, p._path, 0, (std::min(rnl1, rnl2)));
#endif
    if (rnc) {
        return rnc;
    }
    bool hrd1 = has_root_directory(), hrd2 = p.has_root_directory();
    if (hrd1 != hrd2) {
        return hrd1 ? 1 : -1;
    }
    if (hrd1) {
        ++rnl1;
        ++rnl2;
    }
    auto iter1 = _path.begin() + static_cast<int>(rnl1);
    auto iter2 = p._path.begin() + static_cast<int>(rnl2);
    while (iter1 != _path.end() && iter2 != p._path.end() && *iter1 == *iter2) {
        ++iter1;
        ++iter2;
    }
    if (iter1 == _path.end()) {
        return iter2 == p._path.end() ? 0 : -1;
    }
    if (iter2 == p._path.end()) {
        return 1;
    }
    if (*iter1 == preferred_separator) {
        return -1;
    }
    if (*iter2 == preferred_separator) {
        return 1;
    }
    return *iter1 < *iter2 ? -1 : 1;
#else  // LWG_2936_BEHAVIOUR
#ifdef GHC_OS_WINDOWS
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
    if (rnc) {
        return rnc;
    }
    return _path.compare(rnl1, std::string::npos, p._path, rnl2, std::string::npos);
#else
    return _path.compare(p._path);
#endif
#endif
}